

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O2

void initialise_wcurve(ec_curve *curve,mp_int *p,mp_int *a,mp_int *b,mp_int *nonsquare,mp_int *G_x,
                      mp_int *G_y,mp_int *G_order)

{
  WeierstrassCurve *wc;
  WeierstrassPoint *pWVar1;
  mp_int *pmVar2;
  
  initialise_common(curve,EC_WEIERSTRASS,p,0);
  wc = ecc_weierstrass_curve(p,a,b,nonsquare);
  (curve->field_6).w.wc = wc;
  pWVar1 = ecc_weierstrass_point_new(wc,G_x,G_y);
  (curve->field_6).w.G = pWVar1;
  pmVar2 = mp_copy(G_order);
  (curve->field_6).w.G_order = pmVar2;
  return;
}

Assistant:

static void initialise_wcurve(
    struct ec_curve *curve, mp_int *p, mp_int *a, mp_int *b,
    mp_int *nonsquare, mp_int *G_x, mp_int *G_y, mp_int *G_order)
{
    initialise_common(curve, EC_WEIERSTRASS, p, 0);

    curve->w.wc = ecc_weierstrass_curve(p, a, b, nonsquare);

    curve->w.G = ecc_weierstrass_point_new(curve->w.wc, G_x, G_y);
    curve->w.G_order = mp_copy(G_order);
}